

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall MPLSParser::SubPath_extension(MPLSParser *this,BitStreamWriter *writer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  MPLSStreamInfo *pMVar5;
  size_t subPathNum;
  int iVar6;
  size_t playItemNum;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  pmtIndexList;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  local_60;
  ulong local_48;
  uint *local_40;
  uint *local_38;
  
  local_40 = (writer->super_BitStream).m_buffer;
  local_38 = (writer->super_BitStream).m_initBuffer;
  local_48 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  uVar1 = writer->m_bitWrited;
  subPathNum = (size_t)uVar1;
  iVar2 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar6 = uVar1 + iVar2 * 8;
  iVar2 = uVar1 + iVar2 * 8 + 7;
  if (-1 < iVar6) {
    iVar2 = iVar6;
  }
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,8,8);
  BitStreamWriter::putBits(writer,0xf,0);
  BitStreamWriter::putBits(writer,1,0);
  BitStreamWriter::putBits(writer,8,0);
  pMVar5 = getMVCDependStream(this);
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::vector(&local_60,&(pMVar5->super_M2TSStreamInfo).m_index);
  BitStreamWriter::putBits
            (writer,8,(int)((ulong)((long)local_60.
                                          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_60.
                                         super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555);
  if (local_60.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_60.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    playItemNum = 0;
    do {
      composeSubPlayItem(this,writer,playItemNum,subPathNum,&local_60);
      playItemNum = playItemNum + 1;
    } while (playItemNum <
             (ulong)(((long)local_60.
                            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60.
                            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555));
  }
  iVar3 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar6 = writer->m_bitWrited + iVar3 * 8;
  iVar3 = writer->m_bitWrited + iVar3 * 8 + 7;
  if (-1 < iVar6) {
    iVar3 = iVar6;
  }
  uVar4 = my_ntohl((iVar3 >> 3) - (iVar2 >> 3));
  iVar2 = (int)local_40 - (int)local_38;
  iVar6 = (int)local_48 + iVar2 * 8;
  iVar2 = (int)local_48 + iVar2 * 8 + 7;
  if (-1 < iVar6) {
    iVar2 = iVar6;
  }
  *(uint32_t *)((long)local_38 + (long)(iVar2 >> 3)) = uVar4;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void MPLSParser::SubPath_extension(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, 0);   // reserved
    writer.putBits(8, 8);   // SubPath_type = 8
    writer.putBits(15, 0);  // reserved
    writer.putBit(0);       // is_repeat_SubPath
    writer.putBits(8, 0);   // reserved

    const std::vector<PMTIndex> pmtIndexList = getMVCDependStream().m_index;
    writer.putBits(8, static_cast<unsigned>(pmtIndexList.size()));  // number_of_SubPlayItems
    for (size_t i = 0; i < pmtIndexList.size(); ++i) composeSubPlayItem(writer, i, 0, pmtIndexList);

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}